

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O0

int video_to_image(char *video_name,char *dir_name)

{
  bool bVar1;
  byte bVar2;
  vector<int,_std::allocator<int>_> local_1b8;
  _InputArray local_198;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string img_path;
  bool success;
  bool flag;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  VideoCapture cap;
  Mat local_80 [8];
  Mat img;
  int local_20;
  int local_1c;
  int num;
  int frame_cnt;
  char *dir_name_local;
  char *video_name_local;
  
  local_1c = 0;
  local_20 = 0;
  cv::Mat::Mat(local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,video_name,&local_d1);
  cv::VideoCapture::VideoCapture((VideoCapture *)local_b0,local_d0,0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  bVar2 = cv::VideoCapture::isOpened();
  if ((bVar2 & 1) == 0) {
    perror("Open video file failed!\n");
  }
  bVar1 = true;
  while (bVar1) {
    cv::_OutputArray::_OutputArray((_OutputArray *)((long)&img_path.field_2 + 8),local_80);
    cv::VideoCapture::read((_OutputArray *)local_b0);
    cv::_OutputArray::~_OutputArray((_OutputArray *)((long)&img_path.field_2 + 8));
    bVar2 = cv::Mat::empty();
    if ((bVar2 & 1) != 0) {
      bVar1 = false;
    }
    if (local_1c % 0x14 == 0) {
      local_20 = local_20 + 1;
      std::operator+(&local_160,dir_name,&forward_slash_abi_cxx11_);
      std::__cxx11::to_string(&local_180,local_20);
      std::operator+(&local_140,&local_160,&local_180);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     &local_140,&suffix_png_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
      cv::_InputArray::_InputArray(&local_198,local_80);
      local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector(&local_1b8);
      cv::imwrite((string *)local_120,&local_198,(vector *)&local_1b8);
      std::vector<int,_std::allocator<int>_>::~vector(&local_1b8);
      cv::_InputArray::~_InputArray(&local_198);
      std::__cxx11::string::~string((string *)local_120);
    }
    local_1c = local_1c + 1;
  }
  cv::VideoCapture::release();
  cv::VideoCapture::~VideoCapture((VideoCapture *)local_b0);
  cv::Mat::~Mat(local_80);
  return 0;
}

Assistant:

int video_to_image(const char *video_name, const char *dir_name) {
  int frame_cnt = 0;
  int num = 0;
  Mat img;

  VideoCapture cap(video_name);
  if (!cap.isOpened()) perror("Open video file failed!\n");

  bool flag = true;
  while (flag) {
    bool success = cap.read(img);
    if (img.empty()) flag = false;

    if (frame_cnt % 20 == 0) {
      ++num;
      string img_path = dir_name + forward_slash + to_string(num) + suffix_png;
      imwrite(img_path, img);
    }
    ++frame_cnt;
  }
  cap.release();
  return 0;
}